

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O2

REF_STATUS ref_list_contains(REF_LIST ref_list,REF_INT item,REF_BOOL *contains)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  
  *contains = 0;
  uVar3 = 0;
  uVar2 = (ulong)(uint)ref_list->n;
  if (ref_list->n < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar2 == uVar3) {
      return 0;
    }
    piVar1 = ref_list->value + uVar3;
    uVar3 = uVar3 + 1;
  } while (*piVar1 != item);
  *contains = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_list_contains(REF_LIST ref_list, REF_INT item,
                                     REF_BOOL *contains) {
  REF_INT i;

  *contains = REF_FALSE;

  for (i = 0; i < ref_list_n(ref_list); i++)
    if (ref_list->value[i] == item) {
      *contains = REF_TRUE;
      return REF_SUCCESS;
    }

  return REF_SUCCESS;
}